

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResultStrAccum(sqlite3_context *pCtx,StrAccum *p)

{
  sqlite3_context *in_RSI;
  char *in_RDI;
  sqlite3_context *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int n;
  
  if (*(char *)((long)&in_RSI->pVdbe + 4) == '\0') {
    n = (int)((ulong)in_RSI >> 0x20);
    if (((ulong)in_RSI->pVdbe & 0x40000000000) == 0) {
      sqlite3_result_text(unaff_retaddr,in_RDI,n,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      sqlite3_str_reset((StrAccum *)0x2225ee);
    }
    else {
      sqlite3_result_text(unaff_retaddr,in_RDI,n,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
  }
  else {
    sqlite3_result_error_code(in_RSI,in_stack_ffffffffffffffec);
    sqlite3_str_reset((StrAccum *)0x222596);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResultStrAccum(sqlite3_context *pCtx, StrAccum *p){
  if( p->accError ){
    sqlite3_result_error_code(pCtx, p->accError);
    sqlite3_str_reset(p);
  }else if( isMalloced(p) ){
    sqlite3_result_text(pCtx, p->zText, p->nChar, SQLITE_DYNAMIC);
  }else{
    sqlite3_result_text(pCtx, "", 0, SQLITE_STATIC);
    sqlite3_str_reset(p);
  }
}